

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U>::insert
          (SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U> *this,
          VariableData **key,VmConstant **value)

{
  uint uVar1;
  Node *pNVar2;
  Node *item;
  uint i;
  uint local_24;
  uint bucket;
  uint bucketMask;
  VmConstant **value_local;
  VariableData **key_local;
  SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U> *this_local;
  
  _bucket = value;
  value_local = (VmConstant **)key;
  key_local = (VariableData **)this;
  if (*key == (VariableData *)0x0) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0x3b,
                  "void SmallDenseMap<VariableData *, VmConstant *, VariableDataHasher, 16>::insert(const Key &, const Value &) [Key = VariableData *, Value = VmConstant *, Hasher = VariableDataHasher, N = 16]"
                 );
  }
  if (this->bucketCount <= this->count + (this->count >> 2)) {
    rehash(this);
  }
  local_24 = this->bucketCount - 1;
  uVar1 = VariableDataHasher::operator()
                    ((VariableDataHasher *)((long)&item + 7),(VariableData *)*value_local);
  item._0_4_ = 0;
  while( true ) {
    i = uVar1 & local_24;
    if (this->bucketCount <= (uint)item) {
      __assert_fail("!\"couldn\'t insert node\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                    ,0x5b,
                    "void SmallDenseMap<VariableData *, VmConstant *, VariableDataHasher, 16>::insert(const Key &, const Value &) [Key = VariableData *, Value = VmConstant *, Hasher = VariableDataHasher, N = 16]"
                   );
    }
    pNVar2 = this->data + i;
    if (pNVar2->key == (VariableData *)0x0) break;
    if (pNVar2->key == (VariableData *)*value_local) {
      pNVar2->value = *_bucket;
      return;
    }
    uVar1 = i + (uint)item + 1;
    item._0_4_ = (uint)item + 1;
  }
  pNVar2->key = (VariableData *)*value_local;
  pNVar2->value = *_bucket;
  this->count = this->count + 1;
  return;
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}